

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_ARB1_opcode_dss(Context *ctx,char *opcode)

{
  size_t in_RCX;
  size_t in_RDX;
  char src1 [64];
  char src0 [64];
  char dst [64];
  char acStack_e8 [64];
  char local_a8 [64];
  char local_68 [64];
  
  make_ARB1_destarg_string(ctx,local_68,in_RDX);
  make_ARB1_srcarg_string_in_buf(ctx,ctx->source_args,local_a8,in_RCX);
  make_ARB1_srcarg_string_in_buf(ctx,ctx->source_args + 1,acStack_e8,in_RCX);
  output_line(ctx,"%s%s, %s, %s;",opcode,local_68,local_a8,acStack_e8);
  emit_ARB1_dest_modifiers(ctx);
  return;
}

Assistant:

static void emit_ARB1_opcode_dss(Context *ctx, const char *opcode)
{
    char dst[64]; make_ARB1_destarg_string(ctx, dst, sizeof (dst));
    char src0[64]; make_ARB1_srcarg_string(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_ARB1_srcarg_string(ctx, 1, src1, sizeof (src1));
    output_line(ctx, "%s%s, %s, %s;", opcode, dst, src0, src1);
    emit_ARB1_dest_modifiers(ctx);
}